

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall
QtMWidgets::MessageBox::addButton(MessageBox *this,QAbstractButton *button,ButtonRole role)

{
  bool bVar1;
  parameter_type t;
  ButtonRole role_local;
  QAbstractButton *button_local;
  Object local_30 [8];
  code *local_28;
  undefined8 uStack_20;
  
  role_local = role;
  button_local = button;
  bVar1 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                    (&((this->d).d)->buttonsMap,&button_local);
  if (!bVar1) {
    t = (parameter_type)operator_new(0x28);
    QFrame::QFrame(t,((this->d).d)->frame,0);
    QFrame::setFrameStyle((int)t);
    QList<QFrame_*>::append(&((this->d).d)->buttonSeparators,t);
    QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::insert
              (&((this->d).d)->buttonsMap,&button_local,&role_local);
    QList<QAbstractButton_*>::append(&((this->d).d)->buttons,button_local);
    QBoxLayout::addWidget(((this->d).d)->hbox,t,0);
    QBoxLayout::addWidget(((this->d).d)->hbox,button_local,0);
    local_28 = _q_clicked;
    uStack_20 = 0;
    QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::MessageBox::*)()>
              (local_30,(offset_in_QAbstractButton_to_subr)button_local,
               (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_30);
    local_28 = (code *)(**(code **)(*(long *)((this->d).d)->vbox + 0xf0))();
    QWidget::resize((QSize *)this);
    MessageBoxPrivate::adjustSize((this->d).d);
  }
  return;
}

Assistant:

void
MessageBox::addButton( QAbstractButton * button, ButtonRole role )
{
	if( !d->buttonsMap.contains( button ) )
	{
		QFrame * line = new QFrame( d->frame );
		line->setFrameStyle( QFrame::VLine | QFrame::Sunken );

		d->buttonSeparators.append( line );
		d->buttonsMap.insert( button, role );
		d->buttons.append( button );

		d->hbox->addWidget( line );
		d->hbox->addWidget( button );

		connect( button, &QAbstractButton::clicked,
			this, &MessageBox::_q_clicked );

		resize( d->vbox->sizeHint() );

		d->adjustSize();
	}
}